

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_buffer.cc
# Opt level: O0

Slice * __thiscall raptor::SliceBuffer::Merge(Slice *__return_storage_ptr__,SliceBuffer *this)

{
  bool bVar1;
  size_t sVar2;
  const_reference oth;
  pointer pSVar3;
  uint8_t *__src;
  size_t blk_size;
  __normal_iterator<const_raptor::Slice_*,_std::vector<raptor::Slice,_std::allocator<raptor::Slice>_>_>
  local_48;
  const_iterator it;
  uint8_t *local_30;
  uint8_t *buf;
  size_t len;
  SliceBuffer *this_local;
  Slice *ret;
  
  sVar2 = Count(this);
  if (sVar2 == 0) {
    Slice::Slice(__return_storage_ptr__);
  }
  else {
    sVar2 = Count(this);
    if (sVar2 == 1) {
      oth = std::vector<raptor::Slice,_std::allocator<raptor::Slice>_>::operator[](&this->_vs,0);
      Slice::Slice(__return_storage_ptr__,oth);
    }
    else {
      sVar2 = GetBufferLength(this);
      MakeSliceByLength(__return_storage_ptr__,sVar2);
      local_30 = Slice::Buffer(__return_storage_ptr__);
      local_48._M_current =
           (Slice *)std::vector<raptor::Slice,_std::allocator<raptor::Slice>_>::begin(&this->_vs);
      while( true ) {
        blk_size = (size_t)std::vector<raptor::Slice,_std::allocator<raptor::Slice>_>::end
                                     (&this->_vs);
        bVar1 = __gnu_cxx::operator!=
                          (&local_48,
                           (__normal_iterator<const_raptor::Slice_*,_std::vector<raptor::Slice,_std::allocator<raptor::Slice>_>_>
                            *)&blk_size);
        if (!bVar1) break;
        pSVar3 = __gnu_cxx::
                 __normal_iterator<const_raptor::Slice_*,_std::vector<raptor::Slice,_std::allocator<raptor::Slice>_>_>
                 ::operator->(&local_48);
        sVar2 = Slice::size(pSVar3);
        if (sVar2 != 0) {
          pSVar3 = __gnu_cxx::
                   __normal_iterator<const_raptor::Slice_*,_std::vector<raptor::Slice,_std::allocator<raptor::Slice>_>_>
                   ::operator->(&local_48);
          __src = Slice::begin(pSVar3);
          memcpy(local_30,__src,sVar2);
          local_30 = local_30 + sVar2;
        }
        __gnu_cxx::
        __normal_iterator<const_raptor::Slice_*,_std::vector<raptor::Slice,_std::allocator<raptor::Slice>_>_>
        ::operator++(&local_48);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Slice SliceBuffer::Merge() const {

    if (Count() == 0) {
        return Slice();
    }

    if (Count() == 1) {
        return _vs[0];
    }

    size_t len = GetBufferLength();
    Slice ret = MakeSliceByLength(len);
    uint8_t* buf = ret.Buffer();
    for (auto it = _vs.begin(); it != _vs.end(); ++it) {
        size_t blk_size = it->size();
        if (blk_size > 0) {
            memcpy(buf, it->begin(), blk_size);
            buf += blk_size;
        }
    }
    return ret;
}